

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O2

void sx_rng_seed(sx_rng *rng,uint32_t seed)

{
  uint64_t uVar1;
  
  uVar1 = sx__rng_avalanche64((ulong)seed * 2 + 1);
  rng->state[0] = 0;
  rng->state[1] = uVar1 * 2 + 1;
  sx_rng_gen(rng);
  uVar1 = sx__rng_avalanche64(uVar1);
  rng->state[0] = rng->state[0] + uVar1;
  sx_rng_gen(rng);
  return;
}

Assistant:

void sx_rng_seed(sx_rng* rng, uint32_t seed)
{
    uint64_t value = (((uint64_t)seed) << 1ull) | 1ull;    // make it odd
    value = sx__rng_avalanche64(value);
    rng->state[0] = 0ull;
    rng->state[1] = (value << 1ull) | 1ull;
    sx_rng_gen(rng);
    rng->state[0] += sx__rng_avalanche64(value);
    sx_rng_gen(rng);
}